

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

string * booster::locale::time_zone::global(string *new_id)

{
  string *psVar1;
  unique_lock<std::mutex> *in_RSI;
  string *in_RDI;
  unique_lock<std::mutex> lock;
  string *id;
  mutex_type *in_stack_ffffffffffffffa8;
  unique_lock<std::mutex> *in_stack_ffffffffffffffb0;
  
  tz_mutex();
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  psVar1 = tz_id_abi_cxx11_();
  std::__cxx11::string::string((string *)in_RDI,(string *)psVar1);
  psVar1 = tz_id_abi_cxx11_();
  std::__cxx11::string::operator=((string *)psVar1,(string *)in_RSI);
  std::unique_lock<std::mutex>::~unique_lock(in_RSI);
  return in_RDI;
}

Assistant:

std::string global(std::string const &new_id)
    {
        booster::unique_lock<booster::mutex> lock(tz_mutex());
        std::string id = tz_id();
        tz_id() = new_id;
        return id;
    }